

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NonConstFuncs.cpp
# Opt level: O0

Type * __thiscall
slang::ast::builtins::TimeScaleFunc::checkArguments
          (TimeScaleFunc *this,ASTContext *context,Args *args,SourceRange range,Expression *param_5)

{
  SourceRange sourceRange;
  SourceRange sourceRange_00;
  SourceRange callRange;
  bool bVar1;
  LanguageVersion LVar2;
  SourceLocation this_00;
  size_type sVar3;
  reference ppEVar4;
  Symbol *pSVar5;
  Type *pTVar6;
  ASTContext *in_RCX;
  span<const_slang::ast::Expression_*const,_18446744073709551615UL> *in_RDX;
  SourceLocation in_RDI;
  SystemSubroutine *in_R8;
  SourceLocation in_R9;
  string_view arg;
  Symbol *sym;
  LanguageVersion languageVersion;
  Compilation *comp;
  Diagnostic *in_stack_ffffffffffffff58;
  SourceLocation in_stack_ffffffffffffff68;
  undefined8 in_stack_ffffffffffffff70;
  DiagCode code;
  undefined4 in_stack_ffffffffffffff78;
  undefined4 in_stack_ffffffffffffff7c;
  Diagnostic *in_stack_ffffffffffffff80;
  Args *in_stack_ffffffffffffffa0;
  undefined4 in_stack_ffffffffffffffac;
  undefined1 isMethod;
  SourceLocation min;
  Type *local_8;
  
  code = SUB84((ulong)in_stack_ffffffffffffff70 >> 0x20,0);
  isMethod = (undefined1)((uint)in_stack_ffffffffffffffac >> 0x18);
  min = in_RDI;
  this_00 = (SourceLocation)ASTContext::getCompilation((ASTContext *)0xb257f1);
  callRange.endLoc = in_R9;
  callRange.startLoc = this_00;
  bVar1 = SystemSubroutine::checkArgCount
                    (in_R8,in_RCX,(bool)isMethod,in_stack_ffffffffffffffa0,callRange,(size_t)min,
                     (size_t)in_RCX);
  if (bVar1) {
    if (((*(byte *)((long)in_RDI + 0x38) & 1) != 0) &&
       (LVar2 = Compilation::languageVersion((Compilation *)0xb2589a), (int)LVar2 < 1)) {
      sourceRange.endLoc = in_stack_ffffffffffffff68;
      sourceRange.startLoc = in_RDI;
      in_stack_ffffffffffffff58 =
           ASTContext::addDiag((ASTContext *)in_stack_ffffffffffffff58,code,sourceRange);
      arg = slang::toString(Default);
      Diagnostic::operator<<(in_stack_ffffffffffffff80,arg);
    }
    sVar3 = std::span<const_slang::ast::Expression_*const,_18446744073709551615UL>::size
                      ((span<const_slang::ast::Expression_*const,_18446744073709551615UL> *)0xb2591f
                      );
    if (sVar3 != 0) {
      ppEVar4 = std::span<const_slang::ast::Expression_*const,_18446744073709551615UL>::operator[]
                          (in_RDX,0);
      Expression::as<slang::ast::ArbitrarySymbolExpression>(*ppEVar4);
      pSVar5 = not_null<const_slang::ast::Symbol_*>::operator*
                         ((not_null<const_slang::ast::Symbol_*> *)0xb2594e);
      if (((pSVar5->kind != Instance) && (pSVar5->kind != CompilationUnit)) &&
         (pSVar5->kind != Root)) {
        not_null<const_slang::ast::Scope_*>::operator->
                  ((not_null<const_slang::ast::Scope_*> *)0xb2598a);
        bVar1 = Scope::isUninstantiated
                          ((Scope *)CONCAT44(in_stack_ffffffffffffff7c,in_stack_ffffffffffffff78));
        if (!bVar1) {
          ppEVar4 = std::span<const_slang::ast::Expression_*const,_18446744073709551615UL>::
                    operator[](in_RDX,0);
          sourceRange_00.endLoc = ((*ppEVar4)->sourceRange).startLoc;
          sourceRange_00.startLoc = in_RDI;
          ASTContext::addDiag((ASTContext *)in_stack_ffffffffffffff58,
                              SUB84(((*ppEVar4)->sourceRange).endLoc,4),sourceRange_00);
        }
        pTVar6 = Compilation::getErrorType((Compilation *)this_00);
        return pTVar6;
      }
    }
    local_8 = Compilation::getIntType((Compilation *)this_00);
  }
  else {
    local_8 = Compilation::getErrorType((Compilation *)this_00);
  }
  return local_8;
}

Assistant:

const Type& checkArguments(const ASTContext& context, const Args& args, SourceRange range,
                               const Expression*) const final {
        auto& comp = context.getCompilation();
        if (!checkArgCount(context, false, args, range, isOptional ? 0 : 1, 1))
            return comp.getErrorType();

        if (isOptional) {
            auto languageVersion = comp.languageVersion();
            if (languageVersion < LanguageVersion::v1800_2023)
                context.addDiag(diag::WrongLanguageVersion, range) << toString(languageVersion);
        }

        if (args.size() > 0) {
            auto& sym = *args[0]->as<ArbitrarySymbolExpression>().symbol;
            if (sym.kind != SymbolKind::Instance && sym.kind != SymbolKind::CompilationUnit &&
                sym.kind != SymbolKind::Root) {
                if (!context.scope->isUninstantiated())
                    context.addDiag(diag::ExpectedModuleName, args[0]->sourceRange);
                return comp.getErrorType();
            }
        }

        return comp.getIntType();
    }